

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void stats_print_atexit(void)

{
  uint uVar1;
  arena_t *mutex;
  long *in_FS_OFFSET;
  tcache_slow_t *tcache_slow;
  arena_t *arena;
  uint i;
  uint narenas;
  tsdn_t *tsdn;
  tsd_t *tsd;
  tcache_slow_t *local_68;
  tcache_slow_t *local_60;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  arena_t *arena_00;
  arena_t *tcache;
  arena_t *in_stack_ffffffffffffffc8;
  arena_t *in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  arena_t *in_stack_ffffffffffffffe0;
  
  if (duckdb_je_tsd_booted) {
    in_stack_ffffffffffffffdf = 0;
    in_stack_ffffffffffffffde = 0;
    arena_00 = (arena_t *)(*in_FS_OFFSET + -0x2a90);
    in_stack_ffffffffffffffc8 = arena_00;
    in_stack_ffffffffffffffd0 = arena_00;
    in_stack_ffffffffffffffe0 = arena_00;
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      arena_00 = (arena_t *)
                 duckdb_je_tsd_fetch_slow
                           ((tsd_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
      in_stack_ffffffffffffffc8 = arena_00;
      in_stack_ffffffffffffffe0 = arena_00;
    }
  }
  else {
    arena_00 = (arena_t *)0x0;
  }
  uVar2 = 0;
  tcache = arena_00;
  uVar1 = duckdb_je_narenas_total_get();
  for (; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    mutex = arena_get((tsdn_t *)tcache,(uint)((ulong)arena_00 >> 0x20),
                      SUB81((ulong)arena_00 >> 0x18,0));
    if (mutex != (arena_t *)0x0) {
      malloc_mutex_lock((tsdn_t *)arena_00,(malloc_mutex_t *)CONCAT44(uVar1,uVar2));
      local_60 = (mutex->tcache_ql).qlh_first;
      while (local_60 != (tcache_slow_t *)0x0) {
        duckdb_je_tcache_stats_merge
                  ((tsdn_t *)in_stack_ffffffffffffffc8,(tcache_t *)tcache,arena_00);
        if ((local_60->link).qre_next == (mutex->tcache_ql).qlh_first) {
          local_68 = (tcache_slow_t *)0x0;
        }
        else {
          local_68 = (local_60->link).qre_next;
        }
        local_60 = local_68;
      }
      malloc_mutex_unlock((tsdn_t *)CONCAT44(uVar1,uVar2),(malloc_mutex_t *)mutex);
    }
  }
  duckdb_je_malloc_stats_print
            ((write_cb_t *)in_stack_ffffffffffffffe0,
             (void *)CONCAT17(in_stack_ffffffffffffffdf,
                              CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),
             (char *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

static void
stats_print_atexit(void) {
	if (config_stats) {
		tsdn_t *tsdn;
		unsigned narenas, i;

		tsdn = tsdn_fetch();

		/*
		 * Merge stats from extant threads.  This is racy, since
		 * individual threads do not lock when recording tcache stats
		 * events.  As a consequence, the final stats may be slightly
		 * out of date by the time they are reported, if other threads
		 * continue to allocate.
		 */
		for (i = 0, narenas = narenas_total_get(); i < narenas; i++) {
			arena_t *arena = arena_get(tsdn, i, false);
			if (arena != NULL) {
				tcache_slow_t *tcache_slow;

				malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
				ql_foreach(tcache_slow, &arena->tcache_ql,
				    link) {
					tcache_stats_merge(tsdn,
					    tcache_slow->tcache, arena);
				}
				malloc_mutex_unlock(tsdn,
				    &arena->tcache_ql_mtx);
			}
		}
	}
	je_malloc_stats_print(NULL, NULL, opt_stats_print_opts);
}